

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

int __thiscall QPlainTextEditPrivate::init(QPlainTextEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  QWidget *this_00;
  QPlainTextEditControl *pQVar2;
  QTextDocument *this_01;
  ContextType *context;
  QPaintDevice *pQVar3;
  long in_FS_OFFSET;
  QAbstractTextDocumentLayout *layout;
  QTextDocument *doc;
  QPlainTextEdit *q;
  QPalette *in_stack_fffffffffffffca8;
  ulong uVar4;
  QString *text;
  FocusPolicy policy;
  QWidget *in_stack_fffffffffffffcb0;
  QWidget *this_02;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 uVar5;
  QPlainTextDocumentLayout *in_stack_fffffffffffffcc0;
  QTextDocument *in_stack_fffffffffffffcc8;
  QFlagsStorage<Qt::InputMethodHint> hints;
  QWidget *pQVar6;
  QWidgetTextControl *in_stack_fffffffffffffcd0;
  QCursor *this_03;
  offset_in_QPlainTextEdit_to_subr *slot;
  Object *receiverPrivate;
  Object *in_stack_fffffffffffffd10;
  Object *sender;
  Connection *this_04;
  Function in_stack_fffffffffffffd30;
  Connection *this_05;
  ConnectionType CVar7;
  offset_in_QWidgetTextControl_to_subr in_stack_fffffffffffffd40;
  Connection *this_06;
  ConnectionType in_stack_fffffffffffffd50;
  Connection *this_07;
  QCursor local_158 [2];
  QWidget *local_148;
  Connection local_140;
  code *local_138;
  undefined8 uStack_130;
  Connection local_128;
  code *local_120;
  undefined8 uStack_118;
  Connection local_110;
  code *local_108;
  undefined8 local_100;
  Connection local_f8;
  code *local_f0;
  undefined8 local_e8;
  Connection local_e0;
  code *local_d8;
  undefined8 local_d0;
  Connection local_c8;
  code *local_c0;
  undefined8 local_b8;
  Connection local_b0;
  code *local_a8;
  undefined8 local_a0;
  Connection local_98;
  code *local_90;
  undefined8 local_88;
  Connection local_80;
  code *local_78;
  undefined8 uStack_70;
  Connection local_68;
  code *local_60;
  undefined8 local_58;
  Connection local_50;
  code *local_48;
  undefined8 uStack_40;
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  QWidgetData *pQStack_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidget *)q_func(this);
  pQVar2 = (QPlainTextEditControl *)operator_new(0x28);
  QPlainTextEditControl::QPlainTextEditControl
            ((QPlainTextEditControl *)in_stack_fffffffffffffcb0,
             (QPlainTextEdit *)in_stack_fffffffffffffca8);
  this->control = pQVar2;
  slot = (offset_in_QPlainTextEdit_to_subr *)0x10;
  this_01 = (QTextDocument *)operator_new(0x10);
  QTextDocument::QTextDocument(this_01,(QObject *)this->control);
  context = (ContextType *)operator_new((ulong)slot);
  QPlainTextDocumentLayout::QPlainTextDocumentLayout
            (in_stack_fffffffffffffcc0,
             (QTextDocument *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  QTextDocument::setDocumentLayout((QAbstractTextDocumentLayout *)this_01);
  QWidgetTextControl::setDocument(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  hints.i = (Int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  pQVar2 = this->control;
  QWidget::palette(in_stack_fffffffffffffcb0);
  QWidgetTextControl::setPalette
            ((QWidgetTextControl *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_28._8_8_ = verticalScrollbarActionTriggered;
  pQStack_18 = (QWidgetData *)0x0;
  receiverPrivate = (Object *)&stack0xfffffffffffffff0;
  QObjectPrivate::connect<void(QAbstractSlider::*)(int),void(QPlainTextEditPrivate::*)(int)>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd40,receiverPrivate,
             in_stack_fffffffffffffd30,(ConnectionType)((ulong)pQVar2 >> 0x20));
  QMetaObject::Connection::~Connection((Connection *)receiverPrivate);
  sender = (Object *)local_28;
  local_38._8_8_ = this_00;
  QObject::connect<void(QWidgetTextControl::*)(),QPlainTextEditPrivate::init(QString_const&)::__0>
            (sender,in_stack_fffffffffffffd30,(ContextType *)receiverPrivate,
             (anon_class_8_1_54a39811_for_o *)pQVar2,in_stack_fffffffffffffd50);
  QMetaObject::Connection::~Connection((Connection *)sender);
  local_48 = adjustScrollbars;
  uStack_40 = 0;
  pQVar6 = (QWidget *)local_38;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QSizeF_const&),void(QPlainTextEditPrivate::*)()>
            (sender,in_stack_fffffffffffffd40,receiverPrivate,in_stack_fffffffffffffd30,
             (ConnectionType)((ulong)pQVar2 >> 0x20));
  QMetaObject::Connection::~Connection((Connection *)pQVar6);
  local_60 = QPlainTextEdit::blockCountChanged;
  local_58 = 0;
  this_04 = &local_50;
  QObject::connect<void(QWidgetTextControl::*)(int),void(QPlainTextEdit::*)(int)>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,(ConnectionType)in_stack_fffffffffffffd40);
  QMetaObject::Connection::~Connection(this_04);
  local_78 = repaintContents;
  uStack_70 = 0;
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QRectF_const&),void(QPlainTextEditPrivate::*)(QRectF_const&)>
            (sender,in_stack_fffffffffffffd40,receiverPrivate,in_stack_fffffffffffffd30,
             (ConnectionType)((ulong)pQVar2 >> 0x20));
  CVar7 = (ConnectionType)in_stack_fffffffffffffd40;
  QMetaObject::Connection::~Connection(&local_68);
  local_90 = QPlainTextEdit::modificationChanged;
  local_88 = 0;
  this_05 = &local_80;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,CVar7);
  QMetaObject::Connection::~Connection(this_05);
  local_a8 = QPlainTextEdit::textChanged;
  local_a0 = 0;
  QObject::connect<void(QWidgetTextControl::*)(),void(QPlainTextEdit::*)()>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,CVar7);
  QMetaObject::Connection::~Connection(&local_98);
  local_c0 = QPlainTextEdit::undoAvailable;
  local_b8 = 0;
  this_06 = &local_b0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,(ConnectionType)this_06);
  QMetaObject::Connection::~Connection(this_06);
  local_d8 = QPlainTextEdit::redoAvailable;
  local_d0 = 0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,(ConnectionType)this_06);
  QMetaObject::Connection::~Connection(&local_c8);
  local_f0 = QPlainTextEdit::copyAvailable;
  local_e8 = 0;
  this_07 = &local_e0;
  QObject::connect<void(QWidgetTextControl::*)(bool),void(QPlainTextEdit::*)(bool)>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,(ConnectionType)this_06);
  QMetaObject::Connection::~Connection(this_07);
  CVar7 = (ConnectionType)this_07;
  local_108 = QPlainTextEdit::selectionChanged;
  local_100 = 0;
  QObject::connect<void(QWidgetTextControl::*)(),void(QPlainTextEdit::*)()>
            (&pQVar2->super_QWidgetTextControl,(offset_in_QWidgetTextControl_to_subr)this_04,context
             ,slot,(ConnectionType)this_06);
  QMetaObject::Connection::~Connection(&local_f8);
  local_120 = cursorPositionChanged;
  uStack_118 = 0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QPlainTextEditPrivate::*)()>
            (sender,(offset_in_QWidgetTextControl_to_subr)this_06,receiverPrivate,(Function)this_05,
             (ConnectionType)((ulong)pQVar2 >> 0x20));
  QMetaObject::Connection::~Connection(&local_110);
  local_138 = updatePlaceholderVisibility;
  uStack_130 = 0;
  uVar4 = 0;
  this_02 = (QWidget *)0x0;
  QObjectPrivate::connect<void(QWidgetTextControl::*)(),void(QPlainTextEditPrivate::*)()>
            (sender,(offset_in_QWidgetTextControl_to_subr)this_06,receiverPrivate,(Function)this_05,
             (ConnectionType)((ulong)pQVar2 >> 0x20));
  QMetaObject::Connection::~Connection(&local_128);
  text = (QString *)(uVar4 & 0xffffffff00000000);
  local_148 = this_00;
  QObject::connect<void(QWidgetTextControl::*)(),QPlainTextEditPrivate::init(QString_const&)::__1>
            (sender,(offset_in_QWidgetTextControl_to_subr)this_05,(ContextType *)receiverPrivate,
             (anon_class_8_1_54a39811_for_o *)pQVar2,CVar7);
  QMetaObject::Connection::~Connection(&local_140);
  QTextDocument::setTextWidth(-1.0);
  pQVar3 = (QPaintDevice *)QTextDocument::documentLayout();
  QAbstractTextDocumentLayout::setPaintDevice(pQVar3);
  QWidget::font(this_00);
  QTextDocument::setDefaultFont((QFont *)this_01);
  bVar1 = QString::isEmpty((QString *)0x6c2a28);
  if (!bVar1) {
    QWidgetTextControl::setPlainText((QWidgetTextControl *)this_02,text);
  }
  policy = (FocusPolicy)((ulong)text >> 0x20);
  QAbstractSlider::setSingleStep((QAbstractSlider *)this_02,policy);
  uVar5 = 1;
  QAbstractSlider::setSingleStep((QAbstractSlider *)this_02,policy);
  QWidget::setBackgroundRole(this_02,policy);
  QWidget::setAcceptDrops(this_02,SUB41(policy >> 0x18,0));
  QWidget::setFocusPolicy(this_02,policy);
  QWidget::setAttribute
            (pQVar6,(WidgetAttribute)((ulong)sender >> 0x20),SUB81((ulong)sender >> 0x18,0));
  QWidget::setAttribute
            (pQVar6,(WidgetAttribute)((ulong)sender >> 0x20),SUB81((ulong)sender >> 0x18,0));
  QFlags<Qt::InputMethodHint>::QFlags((QFlags<Qt::InputMethodHint> *)this_02,policy);
  QWidget::setInputMethodHints
            ((QWidget *)CONCAT44(uVar5,in_stack_fffffffffffffcb8),(InputMethodHints)hints.i);
  pQVar6 = (this->super_QAbstractScrollAreaPrivate).viewport;
  this_03 = local_158;
  QCursor::QCursor(this_03,IBeamCursor);
  QWidget::setCursor(pQVar6,(QCursor *)this_00);
  QCursor::~QCursor(this_03);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::init(const QString &txt)
{
    Q_Q(QPlainTextEdit);
    control = new QPlainTextEditControl(q);

    QTextDocument *doc = new QTextDocument(control);
    QAbstractTextDocumentLayout *layout = new QPlainTextDocumentLayout(doc);
    doc->setDocumentLayout(layout);
    control->setDocument(doc);

    control->setPalette(q->palette());

    QObjectPrivate::connect(vbar, &QAbstractSlider::actionTriggered,
                            this, &QPlainTextEditPrivate::verticalScrollbarActionTriggered);
    QObject::connect(control, &QWidgetTextControl::microFocusChanged, q,
                     [q](){q->updateMicroFocus(); });
    QObjectPrivate::connect(control, &QWidgetTextControl::documentSizeChanged,
                            this, &QPlainTextEditPrivate::adjustScrollbars);
    QObject::connect(control, &QWidgetTextControl::blockCountChanged,
                     q, &QPlainTextEdit::blockCountChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::updateRequest,
                            this, &QPlainTextEditPrivate::repaintContents);
    QObject::connect(control, &QWidgetTextControl::modificationChanged,
                     q, &QPlainTextEdit::modificationChanged);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, &QPlainTextEdit::textChanged);
    QObject::connect(control, &QWidgetTextControl::undoAvailable, q, &QPlainTextEdit::undoAvailable);
    QObject::connect(control, &QWidgetTextControl::redoAvailable, q, &QPlainTextEdit::redoAvailable);
    QObject::connect(control, &QWidgetTextControl::copyAvailable, q, &QPlainTextEdit::copyAvailable);
    QObject::connect(control, &QWidgetTextControl::selectionChanged, q, &QPlainTextEdit::selectionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::cursorPositionChanged,
                            this, &QPlainTextEditPrivate::cursorPositionChanged);
    QObjectPrivate::connect(control, &QWidgetTextControl::textChanged,
                            this, &QPlainTextEditPrivate::updatePlaceholderVisibility);
    QObject::connect(control, &QWidgetTextControl::textChanged, q, [q](){q->updateMicroFocus(); });

    // set a null page size initially to avoid any relayouting until the textedit
    // is shown. relayoutDocument() will take care of setting the page size to the
    // viewport dimensions later.
    doc->setTextWidth(-1);
    doc->documentLayout()->setPaintDevice(viewport);
    doc->setDefaultFont(q->font());


    if (!txt.isEmpty())
        control->setPlainText(txt);

    hbar->setSingleStep(20);
    vbar->setSingleStep(1);

    viewport->setBackgroundRole(QPalette::Base);
    q->setAcceptDrops(true);
    q->setFocusPolicy(Qt::StrongFocus);
    q->setAttribute(Qt::WA_KeyCompression);
    q->setAttribute(Qt::WA_InputMethodEnabled);
    q->setInputMethodHints(Qt::ImhMultiLine);

#ifndef QT_NO_CURSOR
    viewport->setCursor(Qt::IBeamCursor);
#endif
}